

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O2

void mpmc_pointer_basics<int*,4ul>(void)

{
  code *pcVar1;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  bool bVar2;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  long lVar3;
  ulong uVar4;
  size_t i;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  ResultBuilder DOCTEST_RB;
  size_t N;
  vector<int,_std::allocator<int>_> data;
  MPMC<int_*,_4UL> mpmc;
  int *local_3d8;
  Result local_3d0;
  AssertData local_3b0;
  Expression_lhs<const_unsigned_long> local_338;
  unsigned_long local_328 [2];
  _Vector_base<int,_std::allocator<int>_> local_318;
  MPMC<int_*,_4UL> local_300;
  
  tf::MPMC<int_*,_4UL>::MPMC(&local_300);
  local_328[0] = 0x10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_318,0x11,(allocator_type *)&local_3b0);
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x253;
  local_3b0.m_expr = "mpmc.capacity() == N";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_338.lhs = 0x10;
  local_338.m_at = local_3b0.m_at;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_3d0,&local_338,local_328);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x255;
  local_3b0.m_expr = "mpmc.empty() == true";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_338.lhs =
       0xc00000001 -
       (ulong)((ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i <
              (ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i);
  local_3d8 = (int *)CONCAT71(local_3d8._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_00);
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x256;
  local_3b0.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_3b0.m_at = DT_REQUIRE;
  local_338.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
  local_3d8 = (int *)0x0;
  local_338.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3d0,(Expression_lhs<int*const> *)&local_338,&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_01);
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < local_328[0]; uVar4 = uVar4 + 1) {
    local_3b0.m_exception.field_0.buf[0] = '\0';
    local_3b0._71_2_ = 0x17;
    local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
    local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3b0.m_at = DT_REQUIRE;
    local_3b0.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3b0.m_line = 0x259;
    local_3b0.m_expr = "mpmc.try_enqueue(&data[i]) == true";
    local_3b0.m_failed = true;
    local_3b0.m_threw = false;
    local_3b0.m_threw_as = false;
    local_3b0.m_exception_type = "";
    local_3b0.m_exception_string = "";
    bVar2 = tf::MPMC<int_*,_4UL>::try_enqueue
                      (&local_300,
                       (int *)((long)local_318._M_impl.super__Vector_impl_data._M_start + lVar3));
    local_338.lhs = (ulong)bVar2 | 0xc00000000;
    local_3d8 = (int *)CONCAT71(local_3d8._1_7_,1);
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
    doctest::String::~String(&local_3d0.m_decomp);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
    doctest::AssertData::~AssertData(&local_3b0);
    lVar3 = lVar3 + 4;
  }
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x25c;
  local_3b0.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  bVar2 = tf::MPMC<int_*,_4UL>::try_enqueue
                    (&local_300,local_318._M_impl.super__Vector_impl_data._M_start + local_328[0]);
  local_338.lhs = (ulong)bVar2 | 0xc00000000;
  local_3d8 = (int *)((ulong)local_3d8 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_03);
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x25d;
  local_3b0.m_expr = "mpmc.empty() == false";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_338.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_3d8 = (int *)((ulong)local_3d8 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_04);
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < local_328[0]; uVar4 = uVar4 + 1) {
    local_3b0.m_exception.field_0.buf[0] = '\0';
    local_3b0._71_2_ = 0x17;
    local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
    local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3b0.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3b0.m_line = 0x260;
    local_3b0.m_expr = "mpmc.try_dequeue() == &data[i]";
    local_3b0.m_failed = true;
    local_3b0.m_threw = false;
    local_3b0.m_threw_as = false;
    local_3b0.m_exception_type = "";
    local_3b0.m_exception_string = "";
    local_3b0.m_at = DT_REQUIRE;
    local_338.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
    local_3d8 = (int *)((long)local_318._M_impl.super__Vector_impl_data._M_start + lVar3);
    local_338.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<int*const>::operator==
              (&local_3d0,(Expression_lhs<int*const> *)&local_338,&local_3d8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
    doctest::String::~String(&local_3d0.m_decomp);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
    doctest::AssertData::~AssertData(&local_3b0);
    lVar3 = lVar3 + 4;
  }
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x263;
  local_3b0.m_expr = "mpmc.empty() == true";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_338.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_3d8 = (int *)CONCAT71(local_3d8._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_06);
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x264;
  local_3b0.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  local_3b0.m_at = DT_REQUIRE;
  local_338.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
  local_3d8 = (int *)0x0;
  local_338.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3d0,(Expression_lhs<int*const> *)&local_338,&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_07);
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < local_328[0]; uVar4 = uVar4 + 1) {
    tf::MPMC<int_*,_4UL>::enqueue
              (&local_300,(int *)((long)local_318._M_impl.super__Vector_impl_data._M_start + lVar3))
    ;
    lVar3 = lVar3 + 4;
  }
  local_3b0.m_exception.field_0.buf[0] = '\0';
  local_3b0._71_2_ = 0x17;
  local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
  local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3b0.m_at = DT_REQUIRE;
  local_3b0.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3b0.m_line = 0x269;
  local_3b0.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3b0.m_failed = true;
  local_3b0.m_threw = false;
  local_3b0.m_threw_as = false;
  local_3b0.m_exception_type = "";
  local_3b0.m_exception_string = "";
  bVar2 = tf::MPMC<int_*,_4UL>::try_enqueue
                    (&local_300,local_318._M_impl.super__Vector_impl_data._M_start + local_328[0]);
  local_338.lhs = (ulong)bVar2 | 0xc00000000;
  local_3d8 = (int *)((ulong)local_3d8 & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
  doctest::String::~String(&local_3d0.m_decomp);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_08);
  if (extraout_AL_08 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
  doctest::AssertData::~AssertData(&local_3b0);
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    if (local_328[0] <= uVar4) {
      local_3b0.m_exception.field_0.buf[0] = '\0';
      local_3b0._71_2_ = 0x17;
      local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
      local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3b0.m_at = DT_REQUIRE;
      local_3b0.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3b0.m_line = 0x270;
      local_3b0.m_expr = "mpmc.empty() == true";
      local_3b0.m_failed = true;
      local_3b0.m_threw = false;
      local_3b0.m_threw_as = false;
      local_3b0.m_exception_type = "";
      local_3b0.m_exception_string = "";
      local_338.lhs =
           (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                  (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) |
           0xc00000000;
      local_3d8 = (int *)CONCAT71(local_3d8._1_7_,1);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
      doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
      doctest::String::~String(&local_3d0.m_decomp);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_11);
      if (extraout_AL_11 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
      doctest::AssertData::~AssertData(&local_3b0);
      local_3b0.m_exception.field_0.buf[0] = '\0';
      local_3b0._71_2_ = 0x17;
      local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
      local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3b0.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3b0.m_line = 0x271;
      local_3b0.m_expr = "mpmc.try_dequeue() == nullptr";
      local_3b0.m_failed = true;
      local_3b0.m_threw = false;
      local_3b0.m_threw_as = false;
      local_3b0.m_exception_type = "";
      local_3b0.m_exception_string = "";
      local_3b0.m_at = DT_REQUIRE;
      local_338.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
      local_3d8 = (int *)0x0;
      local_338.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_3d0,(Expression_lhs<int*const> *)&local_338,&local_3d8);
      doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
      doctest::String::~String(&local_3d0.m_decomp);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_12);
      if (extraout_AL_12 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
      doctest::AssertData::~AssertData(&local_3b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_318);
      return;
    }
    local_3b0.m_exception.field_0.buf[0] = '\0';
    local_3b0._71_2_ = 0x17;
    local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
    local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3b0.m_at = DT_REQUIRE;
    local_3b0.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3b0.m_line = 0x26c;
    local_3b0.m_expr = "mpmc.empty() == false";
    local_3b0.m_failed = true;
    local_3b0.m_threw = false;
    local_3b0.m_threw_as = false;
    local_3b0.m_exception_type = "";
    local_3b0.m_exception_string = "";
    local_338.lhs =
         (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000
    ;
    local_3d8 = (int *)((ulong)local_3d8._1_7_ << 8);
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_3d0,(Expression_lhs<bool_const> *)&local_338,(bool *)&local_3d8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
    doctest::String::~String(&local_3d0.m_decomp);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_09);
    if (extraout_AL_09 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
    doctest::AssertData::~AssertData(&local_3b0);
    local_3b0.m_exception.field_0.buf[0] = '\0';
    local_3b0._71_2_ = 0x17;
    local_3b0.m_decomp.field_0.buf[0x17] = '\x17';
    local_3b0.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3b0.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3b0.m_line = 0x26d;
    local_3b0.m_expr = "mpmc.try_dequeue() == &data[i]";
    local_3b0.m_failed = true;
    local_3b0.m_threw = false;
    local_3b0.m_threw_as = false;
    local_3b0.m_exception_type = "";
    local_3b0.m_exception_string = "";
    local_3b0.m_at = DT_REQUIRE;
    local_338.lhs = (unsigned_long)tf::MPMC<int_*,_4UL>::try_dequeue(&local_300);
    local_3d8 = (int *)((long)local_318._M_impl.super__Vector_impl_data._M_start + lVar3);
    local_338.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<int*const>::operator==
              (&local_3d0,(Expression_lhs<int*const> *)&local_338,&local_3d8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)&local_3b0,&local_3d0);
    doctest::String::~String(&local_3d0.m_decomp);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&local_3b0,__x_10);
    if (extraout_AL_10 != '\0') break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)&local_3b0);
    doctest::AssertData::~AssertData(&local_3b0);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 4;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}